

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcWorkControl::~IfcWorkControl(IfcWorkControl *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  void *pvVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pLVar6;
  undefined1 *puVar7;
  
  pvVar3 = *vtt;
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0x19];
  *(void **)&this->field_0x88 = vtt[0x1a];
  *(void **)&this->field_0x98 = vtt[0x1b];
  *(void **)&this->field_0xd0 = vtt[0x1c];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x1d];
  pcVar4 = (this->UserDefinedControlType).ptr._M_dataplus._M_p;
  paVar1 = &(this->UserDefinedControlType).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->WorkControlType).ptr._M_dataplus._M_p;
  paVar1 = &(this->WorkControlType).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->FinishTime).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->StartTime).
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  pcVar4 = (this->Purpose).ptr._M_dataplus._M_p;
  paVar1 = &(this->Purpose).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pLVar6 = (this->Creators).ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar6 != (pointer)0x0) {
    operator_delete(pLVar6,(long)(this->Creators).ptr.
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar6);
  }
  p_Var5 = (this->CreationDate).
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  puVar7 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>).field_0x10;
  puVar2 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>).field_0x20;
  if (puVar7 != puVar2) {
    operator_delete(puVar7,*(long *)puVar2 + 1);
  }
  pvVar3 = vtt[2];
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0xe];
  *(void **)&this->field_0x88 = vtt[0xf];
  *(void **)&this->field_0x98 = vtt[0x10];
  if (*(undefined1 **)&this->field_0xa8 != &this->field_0xb8) {
    operator_delete(*(undefined1 **)&this->field_0xa8,*(long *)&this->field_0xb8 + 1);
  }
  pvVar3 = vtt[4];
  *(void **)this = pvVar3;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[7];
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
    return;
  }
  return;
}

Assistant:

IfcWorkControl() : Object("IfcWorkControl") {}